

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void printX509Name(X509_name_st *name)

{
  int iVar1;
  uint uVar2;
  X509_NAME_ENTRY *ne;
  ASN1_OBJECT *o;
  C *pCVar3;
  C *pCVar4;
  X509_NAME *in_RDI;
  ASN1_STRING *data;
  ASN1_OBJECT *object;
  X509_NAME_ENTRY *entry;
  int i;
  int count;
  undefined4 in_stack_ffffffffffffff70;
  ASN1_STRING *in_stack_ffffffffffffffa8;
  int local_10;
  
  iVar1 = X509_NAME_entry_count(in_RDI);
  for (local_10 = 0; local_10 < iVar1; local_10 = local_10 + 1) {
    ne = X509_NAME_get_entry(in_RDI,local_10);
    o = X509_NAME_ENTRY_get_object(ne);
    X509_NAME_ENTRY_get_data(ne);
    uVar2 = OBJ_obj2nid(o);
    axl::cry::getAsn1ObjectString(object);
    pCVar3 = axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                       ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                        CONCAT44(uVar2,in_stack_ffffffffffffff70));
    axl::cry::getAsn1StringString(in_stack_ffffffffffffffa8);
    pCVar4 = axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                       ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                        CONCAT44(uVar2,in_stack_ffffffffffffff70));
    printf("    %4d: %s: %s\n",(ulong)uVar2,pCVar3,pCVar4);
    axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x11751d);
    axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x117527);
  }
  return;
}

Assistant:

void
printX509Name(X509_name_st* name) {
	int count = X509_NAME_entry_count(name);
	for (int i = 0; i < count; i++) {
		X509_NAME_ENTRY* entry = X509_NAME_get_entry(name, i);
		ASN1_OBJECT* object = X509_NAME_ENTRY_get_object(entry);
		ASN1_STRING* data = X509_NAME_ENTRY_get_data(entry);

		printf("    %4d: %s: %s\n", OBJ_obj2nid(object), cry::getAsn1ObjectString(object).sz(), cry::getAsn1StringString(data).sz());
	}
}